

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O2

StringRef __thiscall llvm::Twine::getSingleStringRef(Twine *this)

{
  unsigned_long uVar1;
  Twine *pTVar2;
  StringRef SVar3;
  ulong uVar4;
  StringRef local_18;
  
  if (this->RHSKind != EmptyKind) {
switchD_00dbc583_caseD_2:
    __assert_fail("isSingleStringRef() &&\"This cannot be had as a single stringref!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
                  ,0x1b8,"StringRef llvm::Twine::getSingleStringRef() const");
  }
  switch(this->LHSKind) {
  case EmptyKind:
    local_18.Data._0_4_ = 0;
    local_18.Data._4_4_ = 0;
    local_18.Length._0_4_ = 0;
    local_18.Length._4_4_ = 0;
    break;
  default:
    goto switchD_00dbc583_caseD_2;
  case CStringKind:
    StringRef::StringRef(&local_18,(this->LHS).cString);
    break;
  case StdStringKind:
    uVar1 = *(this->LHS).decUL;
    local_18.Data._0_4_ = (uint)uVar1;
    local_18.Data._4_4_ = (undefined4)(uVar1 >> 0x20);
    uVar4 = (this->LHS).decUL[1];
    goto LAB_00dbc5a7;
  case StringRefKind:
    pTVar2 = (this->LHS).twine;
    local_18.Data._0_4_ = (pTVar2->LHS).decUI;
    local_18.Data._4_4_ = *(undefined4 *)((long)&pTVar2->LHS + 4);
    local_18.Length._0_4_ = (pTVar2->RHS).decUI;
    local_18.Length._4_4_ = *(undefined4 *)((long)&pTVar2->RHS + 4);
    break;
  case SmallStringKind:
    uVar1 = *(this->LHS).decUL;
    uVar4 = (ulong)(uint)(this->LHS).decUL[1];
    local_18.Data._0_4_ = (uint)uVar1;
    local_18.Data._4_4_ = (undefined4)(uVar1 >> 0x20);
LAB_00dbc5a7:
    local_18.Length._0_4_ = (uint)uVar4;
    local_18.Length._4_4_ = (undefined4)(uVar4 >> 0x20);
  }
  SVar3.Data._4_4_ = local_18.Data._4_4_;
  SVar3.Data._0_4_ = (uint)local_18.Data;
  SVar3.Length._0_4_ = (uint)local_18.Length;
  SVar3.Length._4_4_ = local_18.Length._4_4_;
  return SVar3;
}

Assistant:

StringRef getSingleStringRef() const {
      assert(isSingleStringRef() &&"This cannot be had as a single stringref!");
      switch (getLHSKind()) {
      default: llvm_unreachable("Out of sync with isSingleStringRef");
      case EmptyKind:      return StringRef();
      case CStringKind:    return StringRef(LHS.cString);
      case StdStringKind:  return StringRef(*LHS.stdString);
      case StringRefKind:  return *LHS.stringRef;
      case SmallStringKind:
        return StringRef(LHS.smallString->data(), LHS.smallString->size());
      }
    }